

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O3

uint __thiscall
bwtil::ContextAutomata::optimalK
          (ContextAutomata *this,uint overhead,BackwardIterator *bfr,bool verbose)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  time_t tVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  ulint uVar10;
  pointer puVar11;
  ulint uVar12;
  ulint uVar13;
  undefined4 uVar14;
  undefined7 in_register_00000009;
  undefined8 uVar15;
  undefined4 uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint i;
  uint uVar21;
  int iVar22;
  size_t sVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampled_text;
  PartialSums sample_cumulative_counter;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> sample_dynstring;
  allocator_type local_179;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  double local_158;
  ulong local_150;
  double local_148;
  uint local_13c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  long local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  value_type local_e8;
  PartialSums local_e0;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> local_b8;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar26 [64];
  undefined1 extraout_var_00 [56];
  
  auVar25 = in_ZMM1._0_16_;
  local_150 = CONCAT44(local_150._4_4_,overhead);
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  uVar17 = 1000;
  if (this->n < 1000) {
    uVar17 = this->n;
  }
  uVar15 = CONCAT71(in_register_00000009,verbose);
  tVar6 = time((time_t *)0x0);
  uVar16 = (undefined4)((ulong)uVar15 >> 0x20);
  srand((uint)tVar6);
  uVar20 = this->n;
  uVar7 = uVar20 / uVar17;
  auVar2 = vcvtusi2sd_avx512f(auVar25,uVar20);
  auVar24._0_8_ = log2(auVar2._0_8_);
  auVar24._8_56_ = extraout_var;
  uVar14 = vcvttsd2usi_avx512f(auVar24._0_16_);
  uVar8 = uVar20 / CONCAT44(uVar16,uVar14);
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Sampling text ... ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    auVar26._8_56_ = extraout_var_00;
    auVar26._0_8_ = extraout_XMM1_Qa;
    auVar25 = auVar26._0_16_;
    uVar20 = this->n;
  }
  auVar2 = vcvtusi2sd_avx512f(auVar25,uVar8 / uVar17);
  iVar22 = -1;
  auVar25 = vcvtusi2sd_avx512f(auVar25,uVar7);
  local_158 = auVar2._0_8_ / auVar25._0_8_;
  while (iVar3 = (*bfr->_vptr_BackwardIterator[4])(bfr), (char)iVar3 == '\0') {
    if ((this->n - uVar20) % uVar17 == 0) {
      if ((uVar17 <= uVar20) &&
         ((this->n == uVar20 || (iVar3 = rand(), (double)iVar3 * 4.656612875245797e-10 <= local_158)
          ))) {
        uVar21 = 0;
        do {
          iVar3 = (*bfr->_vptr_BackwardIterator[3])(bfr);
          local_b8.number_of_internal_nodes = (symbol)iVar3;
          if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_178,
                       (iterator)
                       local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_b8.number_of_internal_nodes)
            ;
          }
          else {
            *local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b8.number_of_internal_nodes;
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < (uint)uVar17);
      }
      iVar3 = (int)(((this->n - uVar20) * 100) / this->n);
      if ((iVar22 < iVar3 && verbose) && (uint)(iVar3 * -0x33333333) < 0x33333334) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        iVar22 = iVar3;
      }
    }
    uVar20 = uVar20 - 1;
    (*bfr->_vptr_BackwardIterator[3])(bfr);
  }
  (*bfr->_vptr_BackwardIterator[2])(bfr);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n  Sampled text size = ",0x17);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  PartialSums::PartialSums(&local_e0,this->sigma,this->n);
  local_e8 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_100,(ulong)this->sigma,&local_e8,&local_179);
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
            (&local_b8,&local_100);
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar10 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::bitSize(&local_b8);
  local_158 = (double)(uVar10 + 0x1a0 + (ulong)local_e0.nr_of_nodes * 0x40);
  auVar25._8_8_ = in_XMM2_Qb;
  auVar25._0_8_ = in_XMM2_Qa;
  auVar25 = vcvtusi2sd_avx512f(auVar25,this->n + 1);
  local_120 = (ulong)(this->sigma << 3) * 4 + 0xc0;
  local_148 = log2(auVar25._0_8_);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Extimated number of bits per k-mer: ",0x26);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Extimated number of bits per (k-1)-mer: ",0x2a);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar17 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (uVar17 == 0) {
    puVar11 = (pointer)0x0;
    sVar23 = 0;
  }
  else {
    if ((long)uVar17 < 0) {
LAB_0010b117:
      std::__throw_bad_alloc();
    }
    puVar11 = (pointer)operator_new(uVar17);
    sVar23 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar11 + uVar17;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar11;
  if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
    memmove(puVar11,local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,sVar23);
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar11 + sVar23;
  uVar10 = numberOfContexts(this,1,&local_118);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Number of ",0xc);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-mers : ",8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_148;
  uVar4 = vcvttsd2usi_avx512f(auVar2);
  uVar21 = 1;
  if (1 < uVar4) {
    local_148 = (double)(local_150 & 0xffffffff);
    uVar19 = 1;
    lVar18 = 2;
    local_150 = 1 - (ulong)uVar4;
    uVar12 = 1;
    local_13c = uVar4;
    do {
      uVar21 = uVar19;
      if ((this->n * (long)local_148) / 100 < uVar12 * local_120 + uVar10 * (long)local_158) break;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar17 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (uVar17 == 0) {
        puVar11 = (pointer)0x0;
        sVar23 = 0;
      }
      else {
        if ((long)uVar17 < 0) goto LAB_0010b117;
        puVar11 = (pointer)operator_new(uVar17);
        sVar23 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      }
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar11 + uVar17;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar11;
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar11;
        memmove(puVar11,local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,sVar23);
      }
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar11 + sVar23;
      uVar13 = numberOfContexts(this,(uint)lVar18,&local_138);
      if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Number of ",0xc)
        ;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"-mers : ",8);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      uVar19 = uVar19 + 1;
      lVar1 = local_150 + 1 + lVar18;
      lVar18 = lVar18 + 1;
      uVar12 = uVar10;
      uVar10 = uVar13;
      uVar21 = local_13c;
    } while (lVar1 != 2);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_b8.codes);
  std::
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::~vector(&local_b8.wavelet_tree);
  if (local_b8.child1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.child1.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.child0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.child0.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.nodes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.nodes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar5 = 1;
  if (1 < uVar21) {
    uVar5 = uVar21 - 1;
  }
  return uVar5;
}

Assistant:

uint optimalK(uint overhead, BackwardIterator * bfr, bool verbose){

		//strategy: sample randomly n/log n characters of the text (in contiguous blocks of size B)
		//and try k=1,... until suitable k is found. There will be at most log_sigma n iterations, so work is linear.

		ulint B = 1000; //number of characters per block

		if(n<B)
			B = n;

		vector<symbol> sampled_text;

		srand(time(NULL));

		ulint nr_of_blocks = n/B;//total number of blocks in the text
		ulint sampled_n = n/(uint)log2(n);//expected size of sampled text
		ulint nr_of_sampled_blocks = sampled_n/B;//expected number of sampled blocks
		double p = (double)nr_of_sampled_blocks/(double)nr_of_blocks;//probability that a block is sampled

		int perc,last_perc=-1;
		if(verbose)
			cout << "  Sampling text ... " << endl;

		ulint pos = n-1;//current position in the text
		while(not bfr->begin()){

			if(((n-1)-pos)%B==0){

				if(pos+1 >= B ){//if there are at least B characters to be sampled

					if((n-1)-pos==0 or flip_coin(p)){//randomly decide if sample the block

						for(uint i=0;i<B;i++)	//sample B characters
							sampled_text.push_back( bfr->read() );

					}

				}

				perc = (100*((n-1)-pos))/n;

				if(perc>last_perc and (perc%5)==0 and verbose){
					cout << "  " << perc << "% done." << endl;
					last_perc=perc;
				}

			}

			bfr->read();//skip character on text
			pos--;

		}

		bfr->rewind();

		if(verbose)
			cout << "\n  Sampled text size = " << sampled_text.size() << endl;

		/*
		 * Extimate number of bits in memory for each context:
		 * O(sigma * log n) bits for each context.
		 *
		 * Structures in memory:
		 *
		 * vector<uint > prefix_nr;
		 * vector<vector<uint> > edges;
		 * CumulativeCounters * counters;
		 * DynamicString ** dynStrings;
		 * ulint * lengths;
		 *
		 */

		PartialSums sample_cumulative_counter = PartialSums(sigma,n);//sample of cumulative counter to extimate its memory consumption
		DynamicString<bitv> sample_dynstring = DynamicString<bitv>(vector<ulint>(sigma,1));

		ulint bits_per_k_mer =
				CHAR_BIT * sizeof(DynamicString<bitv> *) + //pointers to DynamicStrings
				sample_cumulative_counter.bitSize()  + //cumulative counters
				sample_dynstring.bitSize() + //DynamicStrings
				CHAR_BIT*sizeof(vector<uint >) + //vector prefix_nr
				CHAR_BIT*sizeof(uint) + //content of vector prefix_nr
				CHAR_BIT*sizeof(ulint); //lengths

		ulint bits_per_k_1_mer =
				CHAR_BIT*sizeof(vector<uint>) + //vector edges
				CHAR_BIT*sigma*sizeof(uint); //content of vector edges

		uint log_n = log2(n+1);

		if(verbose) cout << "  Extimated number of bits per k-mer: " << bits_per_k_mer << endl;
		if(verbose) cout << "  Extimated number of bits per (k-1)-mer: " << bits_per_k_1_mer << endl;

		ulint nr_of_k_mers;
		ulint nr_of_k_1_mers=1;//number of (k-1)-mers

		// we want the highest k such that nr_of_contexts*bits_per_context <= n * (overhead/100)

		uint _k = 1;//start from k=1.
		nr_of_k_mers=numberOfContexts( _k, sampled_text);

		if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		while( _k < log_n and (nr_of_k_mers * bits_per_k_mer + nr_of_k_1_mers * bits_per_k_1_mer <= (n * overhead)/100) ){

			_k++;

			nr_of_k_1_mers = nr_of_k_mers;
			nr_of_k_mers=numberOfContexts( _k, sampled_text);

			if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		}

		if(_k > 1)//we found the first _k above the threshold, so decrease _k.
			_k--;
		else
			_k = 1;//minimum k is 1

		return _k;

	}